

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O0

AggregateKernelConfig *
anon_unknown.dwarf_7d218::PercentTotalKernel::Config::create
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *cfg)

{
  Config *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cfg_local;
  
  this = (Config *)operator_new(0x78);
  Config(this,cfg,false);
  return &this->super_AggregateKernelConfig;
}

Assistant:

static AggregateKernelConfig* create(const std::vector<std::string>& cfg) { return new Config(cfg, false); }